

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

void Gia_Iso2ManCollectOrder
               (Gia_Man_t *pGia,int *pPos,int nPos,Vec_Int_t *vRoots,Vec_Int_t *vVec,Vec_Int_t *vMap
               )

{
  int iVar1;
  Gia_Obj_t *pObj;
  int local_3c;
  int iRoot;
  int i;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vVec_local;
  Vec_Int_t *vRoots_local;
  int nPos_local;
  int *pPos_local;
  Gia_Man_t *pGia_local;
  
  Vec_IntClear(vRoots);
  for (local_3c = 0; local_3c < nPos; local_3c = local_3c + 1) {
    pObj = Gia_ManPo(pGia,pPos[local_3c]);
    iVar1 = Gia_ObjId(pGia,pObj);
    Vec_IntPush(vRoots,iVar1);
  }
  Vec_IntClear(vVec);
  Gia_ManIncrementTravId(pGia);
  for (local_3c = 0; iVar1 = Vec_IntSize(vRoots), local_3c < iVar1; local_3c = local_3c + 1) {
    iVar1 = Vec_IntEntry(vRoots,local_3c);
    Gia_Iso2ManCollectOrder_rec(pGia,iVar1,vRoots,vVec,vMap);
  }
  return;
}

Assistant:

void Gia_Iso2ManCollectOrder( Gia_Man_t * pGia, int * pPos, int nPos, Vec_Int_t * vRoots, Vec_Int_t * vVec, Vec_Int_t * vMap )
{
    int i, iRoot;
    Vec_IntClear( vRoots );
    for ( i = 0; i < nPos; i++ )
        Vec_IntPush( vRoots, Gia_ObjId(pGia, Gia_ManPo(pGia, pPos[i])) );
    Vec_IntClear( vVec );
    Gia_ManIncrementTravId( pGia );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_Iso2ManCollectOrder_rec( pGia, iRoot, vRoots, vVec, vMap );
}